

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_set_multicast_interface(uv_udp_t *handle,char *interface_addr)

{
  int iVar1;
  int *piVar2;
  sockaddr_in6 *addr6;
  int iVar3;
  sockaddr_storage addr_st;
  undefined1 local_98 [24];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (interface_addr == (char *)0x0) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_98._16_8_ = 0;
    uStack_80 = 0;
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    if ((handle->flags & 0x400000) == 0) {
      local_98._0_2_ = 2;
      local_98._2_2_ = 0;
      local_98._4_4_ = 0;
    }
    else {
      local_98._0_2_ = 10;
      local_98._2_2_ = 0;
      local_98._4_4_ = 0;
      uStack_80 = 0;
    }
  }
  else {
    iVar1 = uv_ip4_addr(interface_addr,0,(sockaddr_in *)local_98);
    if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(interface_addr,0,(sockaddr_in6 *)local_98), iVar1 != 0)
       ) {
      return -0x16;
    }
  }
  if (local_98._0_2_ == 10) {
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,0x11,&uStack_80,4);
  }
  else {
    if (local_98._0_2_ != 2) {
      __assert_fail("0 && \"unexpected address family\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                    ,0x519,"int uv_udp_set_multicast_interface(uv_udp_t *, const char *)");
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,0x20,local_98 + 4,4);
  }
  iVar3 = 0;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

int uv_udp_set_multicast_interface(uv_udp_t* handle, const char* interface_addr) {
  struct sockaddr_storage addr_st;
  struct sockaddr_in* addr4;
  struct sockaddr_in6* addr6;

  addr4 = (struct sockaddr_in*) &addr_st;
  addr6 = (struct sockaddr_in6*) &addr_st;

  if (!interface_addr) {
    memset(&addr_st, 0, sizeof addr_st);
    if (handle->flags & UV_HANDLE_IPV6) {
      addr_st.ss_family = AF_INET6;
      addr6->sin6_scope_id = 0;
    } else {
      addr_st.ss_family = AF_INET;
      addr4->sin_addr.s_addr = htonl(INADDR_ANY);
    }
  } else if (uv_ip4_addr(interface_addr, 0, addr4) == 0) {
    /* nothing, address was parsed */
  } else if (uv_ip6_addr(interface_addr, 0, addr6) == 0) {
    /* nothing, address was parsed */
  } else {
    return UV_EINVAL;
  }

  if (addr_st.ss_family == AF_INET) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IP,
                   IP_MULTICAST_IF,
                   (void*) &addr4->sin_addr,
                   sizeof(addr4->sin_addr)) == -1) {
      return UV__ERR(errno);
    }
  } else if (addr_st.ss_family == AF_INET6) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IPV6,
                   IPV6_MULTICAST_IF,
                   &addr6->sin6_scope_id,
                   sizeof(addr6->sin6_scope_id)) == -1) {
      return UV__ERR(errno);
    }
  } else {
    assert(0 && "unexpected address family");
    abort();
  }

  return 0;
}